

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O1

bool __thiscall translate::hit(translate *this,ray *r,interval ray_t,hit_record *rec)

{
  element_type *peVar1;
  int iVar2;
  double local_48;
  double local_40;
  double local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  double local_20;
  double local_18;
  
  local_48 = (r->orig).e[0] - (this->offset).e[0];
  local_40 = (r->orig).e[1] - (this->offset).e[1];
  local_38 = (r->orig).e[2] - (this->offset).e[2];
  local_18 = r->tm;
  local_30 = *(undefined4 *)(r->dir).e;
  uStack_2c = *(undefined4 *)((long)(r->dir).e + 4);
  uStack_28 = *(undefined4 *)((r->dir).e + 1);
  uStack_24 = *(undefined4 *)((long)(r->dir).e + 0xc);
  local_20 = (r->dir).e[2];
  peVar1 = (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_hittable[2])(ray_t.min,ray_t.max,peVar1,&local_48);
  if (SUB41(iVar2,0) != false) {
    (rec->p).e[0] = (this->offset).e[0] + (rec->p).e[0];
    (rec->p).e[1] = (this->offset).e[1] + (rec->p).e[1];
    (rec->p).e[2] = (this->offset).e[2] + (rec->p).e[2];
  }
  return SUB41(iVar2,0);
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        // Move the ray backwards by the offset
        ray offset_r(r.origin() - offset, r.direction(), r.time());

        // Determine whether an intersection exists along the offset ray (and if so, where)
        if (!object->hit(offset_r, ray_t, rec))
            return false;

        // Move the intersection point forwards by the offset
        rec.p += offset;

        return true;
    }